

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

void get_cost_surf_min(int *cost_list,int *ir,int *ic,int bits)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = cost_list[1] - cost_list[3];
  uVar1 = cost_list[1] + *cost_list * -2 + cost_list[3];
  *ic = (int)((int)uVar1 / (((int)~(uVar1 ^ uVar2) >> 0x1f) * -4 + -2) + uVar2) / (int)uVar1;
  uVar2 = cost_list[4] - cost_list[2];
  uVar1 = cost_list[4] + *cost_list * -2 + cost_list[2];
  *ir = (int)((int)uVar1 / (((int)~(uVar1 ^ uVar2) >> 0x1f) * -4 + -2) + uVar2) / (int)uVar1;
  return;
}

Assistant:

static inline void get_cost_surf_min(const int *cost_list, int *ir, int *ic,
                                     int bits) {
  *ic = divide_and_round((cost_list[1] - cost_list[3]) * (1 << (bits - 1)),
                         (cost_list[1] - 2 * cost_list[0] + cost_list[3]));
  *ir = divide_and_round((cost_list[4] - cost_list[2]) * (1 << (bits - 1)),
                         (cost_list[4] - 2 * cost_list[0] + cost_list[2]));
}